

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O2

void opj_t1_dec_refpass_step_mqc
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 poshalf,OPJ_INT32 neghalf
               )

{
  ushort uVar1;
  opj_mqc_t *mqc;
  OPJ_INT32 OVar2;
  ulong uVar3;
  int iVar4;
  
  uVar1 = *flagsp;
  if ((uVar1 & 0x5000) == 0x1000) {
    mqc = t1->mqc;
    uVar3 = 0x10;
    if ((uVar1 >> 0xd & 1) == 0) {
      uVar3 = (ulong)(0xf - ((char)uVar1 == '\0'));
    }
    mqc->curctx = mqc->ctxs + uVar3;
    OVar2 = opj_mqc_decode(mqc);
    if (OVar2 == 0) {
      poshalf = neghalf;
    }
    iVar4 = -poshalf;
    if (-1 < *datap) {
      iVar4 = poshalf;
    }
    *datap = iVar4 + *datap;
    *(byte *)((long)flagsp + 1) = *(byte *)((long)flagsp + 1) | 0x20;
  }
  return;
}

Assistant:

static INLINE void opj_t1_dec_refpass_step_mqc(
                opj_t1_t *t1,
                opj_flag_t *flagsp,
                OPJ_INT32 *datap,
                OPJ_INT32 poshalf,
                OPJ_INT32 neghalf)
{
        OPJ_INT32 v, t, flag;
       
        opj_mqc_t *mqc = t1->mqc;       /* MQC component */
       
        flag = *flagsp;
        if ((flag & (T1_SIG | T1_VISIT)) == T1_SIG) {
                opj_mqc_setcurctx(mqc, opj_t1_getctxno_mag((OPJ_UINT32)flag));      /* ESSAI */
                        v = opj_mqc_decode(mqc);
                t = v ? poshalf : neghalf;
                *datap += *datap < 0 ? -t : t;
                *flagsp |= T1_REFINE;
                }
}